

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cClipControlTests.cpp
# Opt level: O0

void __thiscall
gl4cts::ClipControlApi::ClipControlApi(ClipControlApi *this,Context *context,API api)

{
  bool bVar1;
  int iVar2;
  NotSupportedError *this_00;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  allocator<char> local_41;
  string local_40;
  API local_1c;
  Context *pCStack_18;
  API api_local;
  Context *context_local;
  ClipControlApi *this_local;
  
  this->m_context = context;
  local_1c = api;
  pCStack_18 = context;
  context_local = (Context *)this;
  bVar1 = Supported(this->m_context,api);
  if (!bVar1) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Required clip_control extension is not supported",&local_41);
    tcu::NotSupportedError::NotSupportedError(this_00,&local_40);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  if (local_1c < 2) {
    pRVar3 = deqp::Context::getRenderContext(pCStack_18);
    iVar2 = (*pRVar3->_vptr_RenderContext[3])();
    this->clipControl = *(glClipControlFunc *)(CONCAT44(extraout_var,iVar2) + 0x230);
  }
  return;
}

Assistant:

ClipControlApi(deqp::Context& context, ClipControlTests::API api) : m_context(context)
	{
		if (!Supported(m_context, api))
		{
			throw tcu::NotSupportedError("Required clip_control extension is not supported");
		}

		switch (api)
		{
		case ClipControlTests::API_GL_ARB_clip_control:
		case ClipControlTests::API_GL_45core: //fall through
			clipControl = context.getRenderContext().getFunctions().clipControl;
			break;
		}
	}